

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeJSONObject
               (DynamicObject *JSONObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  JavascriptFunction *pJVar2;
  ScriptContext *pSVar3;
  JavascriptMethod entryPoint;
  ScriptConfiguration *this_00;
  JavascriptLibrary *this_01;
  JavascriptString *value;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *JSONObject_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,JSONObject,mode,3,0);
  this = RecyclableObject::GetLibrary(&JSONObject->super_RecyclableObject);
  pJVar2 = EnsureJSONStringifyFunction(this);
  AddMember(this,JSONObject,0x164,pJVar2);
  pSVar3 = RecyclableObject::GetScriptContext(&JSONObject->super_RecyclableObject);
  entryPoint = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JSON::EntryInfo::Stringify);
  pJVar2 = EnsureJSONStringifyFunction(this);
  ScriptContext::SetBuiltInLibraryFunction(pSVar3,entryPoint,pJVar2);
  AddFunctionToLibraryObject(this,JSONObject,0x11d,(FunctionInfo *)JSON::EntryInfo::Parse,2,'\x06');
  pSVar3 = RecyclableObject::GetScriptContext(&JSONObject->super_RecyclableObject);
  this_00 = ScriptContext::GetConfig(pSVar3);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_00);
  if (bVar1) {
    this_01 = RecyclableObject::GetLibrary(&JSONObject->super_RecyclableObject);
    value = CreateStringFromCppLiteral<5ul>(this_01,(char16 (*) [5])0x19283b8);
    AddMember(this,JSONObject,0x1b,value,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(JSONObject,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeJSONObject(DynamicObject* JSONObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(JSONObject, mode, 3);
        JavascriptLibrary* library = JSONObject->GetLibrary();
        library->AddMember(JSONObject, PropertyIds::stringify, library->EnsureJSONStringifyFunction());
        JSONObject->GetScriptContext()->SetBuiltInLibraryFunction(JSON::EntryInfo::Stringify.GetOriginalEntryPoint(), library->EnsureJSONStringifyFunction());
        library->AddFunctionToLibraryObject(JSONObject, PropertyIds::parse, &JSON::EntryInfo::Parse, 2);

        if (JSONObject->GetScriptContext()->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(JSONObject, PropertyIds::_symbolToStringTag, JSONObject->GetLibrary()->CreateStringFromCppLiteral(_u("JSON")), PropertyConfigurable);
        }

        JSONObject->SetHasNoEnumerableProperties(true);

        return true;
    }